

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization_backend.cpp
# Opt level: O0

void __thiscall booster::locale::localization_backend_manager::impl::impl(impl *this,impl *other)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  value_type *in_RDI;
  value_type v;
  const_iterator p;
  string *in_stack_ffffffffffffff78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
  *in_stack_ffffffffffffff80;
  value_type *this_00;
  string local_60 [32];
  string local_40 [8];
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>_>
  local_28 [5];
  
  this_00 = in_RDI;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
            *)0x23ac0e);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_28[0]._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
          ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
                   *)in_stack_ffffffffffffff78);
  while( true ) {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
    ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
           *)in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>,_true>
              (in_stack_ffffffffffffff80);
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>_>
             ::operator->(local_28);
    std::__cxx11::string::operator=(local_60,(string *)ppVar3);
    in_stack_ffffffffffffff78 = local_60 + 0x20;
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>_>
    ::operator->(local_28);
    peVar4 = std::
             __shared_ptr_access<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x23aca6);
    iVar2 = (*peVar4->_vptr_localization_backend[2])();
    in_stack_ffffffffffffff80 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
          *)CONCAT44(extraout_var,iVar2);
    std::__shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2>::
    reset<booster::locale::localization_backend>
              ((__shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2> *)
               this_00,(localization_backend *)in_RDI);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
                 *)this_00,in_RDI);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
    ::~pair(in_stack_ffffffffffffff80);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>_>
    ::operator++(local_28);
  }
  return;
}

Assistant:

impl(impl const &other) :
                default_backends_(other.default_backends_)
            {
                for(all_backends_type::const_iterator p=other.all_backends_.begin();p!=other.all_backends_.end();++p) {
                    all_backends_type::value_type v;
                    v.first=p->first;
                    v.second.reset(p->second->clone());
                    all_backends_.push_back(v);
                }
            }